

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxyd.c
# Opt level: O3

void graceful_shutdown(int signum,siginfo_t *info,void *ptr)

{
  proxy_log(&ph,3,"Caught signal\n");
  if (signum != 0xf) {
    if (signum == 10) goto LAB_00101bb6;
    if (signum != 2) {
      return;
    }
  }
  sentinel = 1;
  if ((0xf < (uint)signum) || ((0x8404U >> (signum & 0x1fU) & 1) == 0)) {
    return;
  }
LAB_00101bb6:
  proxy_shutdown(&ph);
  return;
}

Assistant:

static void graceful_shutdown(int signum, siginfo_t *info, void *ptr)
{
	proxy_log(&ph, LOG_LEVEL_INFO, "Caught signal\n");
	(void)info;
	(void)ptr;

	if (signum == SIGTERM || signum == SIGINT)
		sentinel = 1;

	if (signum == SIGTERM || signum == SIGINT || signum == SIGUSR1)
		proxy_shutdown(&ph);
}